

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::MayIntersect(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  bool bVar2;
  CellRelation CVar3;
  Iterator it;
  S2Point local_38;
  
  MutableS2ShapeIndex::Iterator::Iterator(&it,&this->index_,UNPOSITIONED);
  CVar3 = MutableS2ShapeIndex::Iterator::Locate(&it,(S2CellId)(target->id_).id_);
  if (CVar3 == DISJOINT) {
    bVar2 = false;
  }
  else if (CVar3 == SUBDIVIDED) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    if (it.super_IteratorBase.id_.id_ != (target->id_).id_) {
      bVar1 = BoundaryApproxIntersects(this,&it,target);
      if (!bVar1) {
        S2Cell::GetCenter(&local_38,target);
        bVar2 = Contains(this,&it,&local_38);
      }
    }
  }
  return bVar2;
}

Assistant:

bool S2Loop::MayIntersect(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, there is an
  // intersection to within the S2ShapeIndex error bound (see Contains).
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // If "target" is an index cell, there is an intersection because index cells
  // are created only if they have at least one edge or they are entirely
  // contained by the loop.
  if (it.id() == target.id()) return true;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return true;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}